

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void testWithTranslateRotateAndScale<float>(M44d *m)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint __line;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  float fVar10;
  float fVar11;
  Rand48 rand;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> from;
  undefined8 local_198;
  float local_190;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> to;
  vector<float,_std::allocator<float>_> weights;
  Vec3<float> local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Vec3<float> local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "Testing with known translate/rotate/scale matrix\n");
  Imath_3_2::operator<<(poVar5,m);
  rand._state[0] = 0xd35a;
  rand._state[1] = 0xc826;
  rand._state[2] = 0xd35a;
  from.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  from.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  from.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::operator<<((ostream *)&std::cout,"numPoints: ");
  std::ostream::flush();
  lVar8 = 1;
  do {
    if (lVar8 == 10) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&weights.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::
      ~_Vector_base(&from.
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                   );
      return;
    }
    dVar2 = (double)Imath_3_2::erand48(rand._state);
    dVar4 = (double)Imath_3_2::erand48(rand._state);
    dVar3 = (double)Imath_3_2::erand48(rand._state);
    local_b8.x = (float)dVar2;
    local_b8.y = (float)dVar4;
    local_b8.z = (float)dVar3;
    std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
    emplace_back<Imath_3_2::Vec3<float>>
              ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&from,
               &local_b8);
    dVar2 = (double)Imath_3_2::erand48(rand._state);
    local_b8.x = (float)dVar2;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&weights,&local_b8.x);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar5," ");
    to.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    to.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar7 = 0;
    uVar9 = 0;
    while( true ) {
      uVar6 = ((long)from.
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)from.
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      if (uVar6 <= uVar9) break;
      Imath_3_2::operator*
                ((Vec3<float> *)
                 ((long)&(from.
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar7),m);
      std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
      emplace_back<Imath_3_2::Vec3<float>>
                ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&to,
                 &local_b8);
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0xc;
    }
    Imath_3_2::procrustesRotationAndTranslation<float>
              ((Vec3 *)&local_b8,
               (Vec3 *)from.
                       super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               &(to.
                 super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->x,
               (ulong)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,SUB81(uVar6,0));
    lVar7 = 0;
    uVar9 = 0;
    while( true ) {
      uVar6 = ((long)from.
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)from.
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      fVar10 = (float)((ulong)local_198 >> 0x20);
      if (uVar6 <= uVar9) break;
      Imath_3_2::operator*
                ((Vec3<float> *)
                 ((long)&(from.
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar7),
                 (Matrix44<double> *)&local_b8);
      local_138.z = local_190 -
                    *(float *)((long)&(to.
                                       super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->z + lVar7);
      uVar1 = *(undefined8 *)
               ((long)&(to.
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
      local_138.y = fVar10 - (float)((ulong)uVar1 >> 0x20);
      local_138.x = (float)local_198 - (float)uVar1;
      fVar10 = Imath_3_2::Vec3<float>::length(&local_138);
      if (0.0001 <= fVar10) {
        __line = 0x62;
        goto LAB_0013d88a;
      }
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0xc;
    }
    Imath_3_2::procrustesRotationAndTranslation<float>
              ((Vec3 *)&local_138,
               (Vec3 *)from.
                       super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (ulong)to.
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,SUB81(uVar6,0));
    local_b8.x = local_138.x;
    local_b8.y = local_138.y;
    local_b8.z = local_138.z;
    local_a8 = local_128;
    uStack_a0 = uStack_120;
    local_98 = local_118;
    uStack_90 = uStack_110;
    local_88 = local_108;
    uStack_80 = uStack_100;
    local_78 = local_f8;
    uStack_70 = uStack_f0;
    local_68 = local_e8;
    uStack_60 = uStack_e0;
    local_58 = local_d8;
    uStack_50 = uStack_d0;
    local_48 = local_c8;
    uStack_40 = uStack_c0;
    lVar7 = 0;
    for (uVar9 = 0;
        uVar9 < (ulong)(((long)from.
                               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)from.
                              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar9 = uVar9 + 1)
    {
      Imath_3_2::operator*
                ((Vec3<float> *)
                 ((long)&(from.
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar7),
                 (Matrix44<double> *)&local_b8);
      local_138.z = local_190 -
                    *(float *)((long)&(to.
                                       super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->z + lVar7);
      uVar1 = *(undefined8 *)
               ((long)&(to.
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
      local_138.y = fVar10 - (float)((ulong)uVar1 >> 0x20);
      local_138.x = (float)local_198 - (float)uVar1;
      fVar11 = Imath_3_2::Vec3<float>::length(&local_138);
      if (0.0001 <= fVar11) {
        __line = 0x68;
LAB_0013d88a:
        __assert_fail("(from[i] * res - to[i]).length () < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,__line,
                      "void testWithTranslateRotateAndScale(const Imath_3_2::M44d &) [T = float]");
      }
      lVar7 = lVar7 + 0xc;
    }
    std::_Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::
    ~_Vector_base(&to.
                   super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                 );
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void
testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand (5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3>                           from;
    std::vector<T>                            weights;

    const float eps = 1e-4f;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf())));
        weights.push_back(static_cast<T>(rand.nextf()));
        std::cout << from.size () << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size (); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res =
            IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
                &from[0], &to[0], &weights[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
            &from[0], &to[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);
    }
    std::cout << "  OK\n";
}